

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<wchar_t> * __thiscall
irr::core::string<wchar_t>::append(string<wchar_t> *this,wchar_t *other,u32 length)

{
  if (other != (wchar_t *)0x0) {
    wcslen(other);
    ::std::__cxx11::wstring::append((wchar_t *)this,(ulong)other);
  }
  return this;
}

Assistant:

string<T> &append(const T *const other, u32 length = 0xffffffff)
	{
		if (!other)
			return *this;

		u32 len = calclen(other);
		if (len > length)
			len = length;

		str.append(other, len);
		return *this;
	}